

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O1

bool __thiscall DOMTest::testComment(DOMTest *this,DOMDocument *document)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  DOMNode *pDVar4;
  XMLCh *pXVar5;
  wchar16 *pwVar6;
  wchar16 *pwVar7;
  long lVar8;
  DOMDocument *pDVar9;
  XMLCh *pXVar10;
  XMLCh *pXVar11;
  DOMDocument *pDVar12;
  DOMNode *pDVar13;
  DOMNode *pDVar14;
  bool bVar15;
  
  xercesc_4_0::XMLString::transcode
            ("dBodyLevel31",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar3 = (long *)(**(code **)(*(long *)document + 0x68))(document);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x158))(plVar3,tempStr);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x10))(plVar3,0);
  pDVar4 = (DOMNode *)(**(code **)(*plVar3 + 0x38))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0x68))(pDVar4,1);
  pwVar6 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x10))(pDVar4);
  pwVar7 = (wchar16 *)(**(code **)(*(long *)pXVar5 + 0x10))(pXVar5);
  iVar2 = xercesc_4_0::XMLString::compareString(pwVar6,pwVar7);
  if (((iVar2 == 0) && (lVar8 = (**(code **)(*(long *)pDVar4 + 0x18))(pDVar4), lVar8 != 0)) &&
     (lVar8 = (**(code **)(*(long *)pXVar5 + 0x18))(pXVar5), lVar8 != 0)) {
    pwVar6 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x18))(pDVar4);
    pwVar7 = (wchar16 *)(**(code **)(*(long *)pXVar5 + 0x18))(pXVar5);
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar6,pwVar7);
    bVar15 = true;
    if (iVar2 == 0) goto LAB_001121e4;
  }
  else {
    lVar8 = (**(code **)(*(long *)pDVar4 + 0x18))(pDVar4);
    if (lVar8 == 0) {
      lVar8 = (**(code **)(*(long *)pXVar5 + 0x18))(pXVar5);
      bVar15 = true;
      if (lVar8 == 0) goto LAB_001121e4;
    }
  }
  testComment();
  bVar15 = false;
LAB_001121e4:
  xercesc_4_0::XMLString::transcode
            ("first",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("document",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,document,0);
  pDVar9 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (pDVar9 != document) {
    testComment();
    bVar15 = false;
  }
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,pXVar5,0);
  pXVar10 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pXVar5 != pXVar10) {
    testComment();
    bVar15 = false;
  }
  pXVar10 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,tempStr2,0);
  pXVar11 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pXVar11 != tempStr2) {
    testComment();
    bVar15 = false;
  }
  if (pXVar5 != pXVar10) {
    testComment();
    bVar15 = false;
  }
  if (pXVar5 == pXVar11) {
    testComment();
    bVar15 = false;
  }
  xercesc_4_0::XMLString::transcode
            ("not-exist",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar8 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr3);
  if (lVar8 != 0) {
    testComment();
    bVar15 = false;
  }
  lVar8 = (**(code **)(*(long *)pXVar5 + 0xf0))(pXVar5,tempStr);
  if (lVar8 != 0) {
    testComment();
    bVar15 = false;
  }
  pXVar10 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,0,0);
  lVar8 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pXVar10 != tempStr2) {
    testComment();
    bVar15 = false;
  }
  if (lVar8 != 0) {
    testComment();
    bVar15 = false;
  }
  pDVar12 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,0,0);
  lVar8 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (pDVar9 != pDVar12) {
    testComment();
    bVar15 = false;
  }
  if (lVar8 != 0) {
    testComment();
    bVar15 = false;
  }
  lVar8 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (lVar8 != 0) {
    testComment();
    bVar15 = false;
  }
  lVar8 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (lVar8 != 0) {
    testComment();
    bVar15 = false;
  }
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,document,&userhandler);
  pDVar13 = (DOMNode *)(**(code **)(*(long *)pDVar4 + 0x68))(pDVar4,1);
  if (userhandler.currentType != NODE_CLONED) {
    testComment();
    bVar15 = false;
  }
  iVar2 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar2 != 0) {
    testComment();
    bVar15 = false;
  }
  if ((DOMDocument *)userhandler.currentData != document) {
    testComment();
    bVar15 = false;
  }
  if (userhandler.currentSrc != pDVar4) {
    testComment();
    bVar15 = false;
  }
  if (userhandler.currentDst != pDVar13) {
    testComment();
    bVar15 = false;
  }
  (**(code **)(*(long *)(document + 0x18) + 0xe8))(document + 0x18,tempStr2,document,&userhandler);
  pDVar14 = (DOMNode *)(**(code **)(*(long *)document + 0x78))(document,pDVar4,1);
  if (userhandler.currentType != NODE_IMPORTED) {
    testComment();
    bVar15 = false;
  }
  iVar2 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar2 != 0) {
    testComment();
    bVar15 = false;
  }
  if ((DOMDocument *)userhandler.currentData != document) {
    testComment();
    bVar15 = false;
  }
  if (userhandler.currentSrc != pDVar4) {
    testComment();
    bVar15 = false;
  }
  if (userhandler.currentDst != pDVar14) {
    testComment();
    bVar15 = false;
  }
  (**(code **)(*(long *)pDVar14 + 0xe8))(pDVar14,tempStr2,pDVar4,&userhandler);
  (**(code **)(*(long *)pDVar14 + 0x138))(pDVar14);
  if (userhandler.currentType != NODE_DELETED) {
    testComment();
    bVar15 = false;
  }
  iVar2 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar2 != 0) {
    testComment();
    bVar15 = false;
  }
  if ((DOMNode *)userhandler.currentData != pDVar4) {
    testComment();
    bVar15 = false;
  }
  if (userhandler.currentSrc != (DOMNode *)0x0) {
    testComment();
    bVar15 = false;
  }
  if (userhandler.currentDst != (DOMNode *)0x0) {
    testComment();
    bVar15 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,pDVar4);
  if (cVar1 == '\0') {
    testComment();
    bVar15 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,pXVar5);
  if (cVar1 != '\0') {
    testComment();
    bVar15 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar13);
  if (cVar1 == '\0') {
    testComment();
    bVar15 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar4);
  if (cVar1 == '\0') {
    testComment();
    bVar15 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,document + 0x18);
  if (cVar1 != '\0') {
    testComment();
    bVar15 = false;
  }
  (**(code **)(*(long *)document + 0xf0))(document,pDVar4,0,tempStr2);
  testComment();
  if (bVar15 == false) {
    puts(
        "\n*****The DOMComment* method calls listed above failed, all others worked correctly.*****"
        );
  }
  return bVar15;
}

Assistant:

bool DOMTest::testComment(DOMDocument* document)
{
    DOMNode* node;
    DOMNode* node2;
    bool T = true;
    bool OK = true;
// For debugging*****   printf("\n          testComment's outputs:\n");
    XMLString::transcode("dBodyLevel31", tempStr, 3999);
    node = document->getDocumentElement()->getElementsByTagName(tempStr)->item(0)->getFirstChild(); // node gets textNode11
    node2 = node->cloneNode(T);
    // Check nodes for equality, both their name and value or lack thereof
    if (!(!XMLString::compareString(node->getNodeName(), node2->getNodeName()) &&        // Compares node names for equality
          (node->getNodeValue() != 0 && node2->getNodeValue() != 0)     // Checks to make sure each node has a value node
        ? !XMLString::compareString(node->getNodeValue(), node2->getNodeValue())         // If both have value nodes test those value nodes for equality
        : (node->getNodeValue() == 0 && node2->getNodeValue() == 0)))   // If one node doesn't have a value node make sure both don't
    {
        fprintf(stderr, "'cloneNode' did not clone the DOMComment* node correctly\n");
        OK = false;
    }
    // Deep clone test comparison is in testNode & testDocument

    // Test the user data
    // Test simple set and get
    DOMComment* userTest = (DOMComment*) node;
    DOMComment*  userFirst = (DOMComment*) node2;
    XMLCh* userSecond = tempStr2;
    XMLString::transcode("first", tempStr, 3999);

    XMLString::transcode("document", tempStr2, 3999);
    userTest->setUserData(tempStr2, (void*) document, 0);
    void* mydocument = userTest->getUserData(tempStr2);
    if (document != mydocument) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    userTest->setUserData(tempStr, (void*) userFirst, 0);
    void* myFirst = userTest->getUserData(tempStr);
    if (userFirst != myFirst) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test overwrite
    void* myFirst2 = userTest->setUserData(tempStr, (void*) userSecond, 0);
    void* mySecond = userTest->getUserData(tempStr);
    if (userSecond != mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst != myFirst2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst == mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test null
    // test non-exist key
    XMLString::transcode("not-exist", tempStr3, 3999);
    if (userTest->getUserData(tempStr3)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // use a node that does not have user data set before
    if (userFirst->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test reset
    void* mySecond2 = userTest->setUserData(tempStr, (void*) 0, 0);
    void* myNull = userTest->getUserData(tempStr);
    if (userSecond != mySecond2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    void* mydocument2 = userTest->setUserData(tempStr2, (void*) 0, 0);
    void* myNull2 = userTest->getUserData(tempStr2);
    if (mydocument != mydocument2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    //the userTest user data table should be null now
    if (userTest->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userTest->getUserData(tempStr2)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test DOMUserDataHandler
    // test clone
    userTest->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* mycloned = userTest->cloneNode(true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_CLONED, tempStr2, document, userTest, mycloned, __LINE__);

    // test import
    document->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* myimport = document->importNode(userTest,true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_IMPORTED, tempStr2, document, userTest, myimport, __LINE__);

    // test delete
    myimport->setUserData(tempStr2, (void*) userTest, &userhandler);
    myimport->release();
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_DELETED, tempStr2, userTest, 0, 0, __LINE__);

    // Test isSameNode
    if (!userTest->isSameNode(userTest)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isSameNode(userFirst)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test isEqualNode
    if (!userTest->isEqualNode(mycloned)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    if (!userTest->isEqualNode(userTest)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isEqualNode(document)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test rename, should throw exception
    EXCEPTIONSTEST(document->renameNode(userTest, 0, tempStr2), DOMException::NOT_SUPPORTED_ERR, OK, 206 );

    if (!OK)
        printf("\n*****The DOMComment* method calls listed above failed, all others worked correctly.*****\n");
    return OK;
}